

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_312651::Handlers::addBare(Handlers *this,bare_handler_t *fn)

{
  JSONHandler *this_00;
  anon_class_40_2_e8808043 local_60;
  string_handler_t local_38;
  bare_handler_t *local_18;
  bare_handler_t *fn_local;
  Handlers *this_local;
  
  this_00 = this->jh;
  local_60.this = this;
  local_18 = fn;
  fn_local = (bare_handler_t *)this;
  std::function<void_()>::function(&local_60.fn,fn);
  std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::Handlers::addBare(std::function<void()>)::__0,void>
            ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_38,
             &local_60);
  JSONHandler::addStringHandler(this_00,&local_38);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_38);
  (anonymous_namespace)::Handlers::addBare(std::function<void()>)::$_0::~__0((__0 *)&local_60);
  return;
}

Assistant:

void
Handlers::addBare(bare_handler_t fn)
{
    jh->addStringHandler([this, fn](std::string const& path, std::string const& parameter) {
        if (!parameter.empty()) {
            QTC::TC("qpdf", "QPDFJob json bare not empty");
            usage(path + ": value must be the empty string");
        } else {
            fn();
        }
    });
}